

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotTableFormatter.cpp
# Opt level: O3

ostream * cali::format_record_as_table
                    (CaliperMetadataAccessInterface *db,
                    vector<cali::Entry,_std::allocator<cali::Entry>_> *rec,ostream *os)

{
  pointer pEVar1;
  long *plVar2;
  pointer pEVar3;
  ostream *poVar4;
  Node *node;
  Node *pNVar5;
  const_iterator __end1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer pEVar7;
  int iVar8;
  const_iterator __begin1;
  pointer pEVar9;
  pointer pEVar10;
  size_t max_width;
  bool bVar11;
  RecordInfo info;
  string local_88;
  RecordInfo local_68;
  ostream *local_38;
  
  pEVar9 = (rec->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pEVar1 = (rec->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_68.entries.
  super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.max_key_len = 0;
  local_68.entries.
  super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.entries.
  super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.max_right_len = 0;
  if (pEVar9 != pEVar1) {
    local_38 = os;
    do {
      pNVar5 = pEVar9->m_node;
      if (pNVar5 != (Node *)0x0) {
        if (pNVar5->m_attribute == 8) {
          local_88._M_dataplus._M_p = (pointer)(pEVar9->m_value).m_v.type_and_size;
          local_88._M_string_length = *(size_type *)&(pEVar9->m_value).m_v.value;
          anon_unknown.dwarf_1b259d::RecordInfo::add(&local_68,db,pNVar5->m_id,(Variant *)&local_88)
          ;
        }
        else {
          do {
            if (pNVar5->m_attribute == 0xffffffffffffffff) break;
            local_88._M_dataplus._M_p = (pointer)(pNVar5->m_data).m_v.type_and_size;
            local_88._M_string_length = *(size_type *)&(pNVar5->m_data).m_v.value;
            anon_unknown.dwarf_1b259d::RecordInfo::add
                      (&local_68,db,pNVar5->m_attribute,(Variant *)&local_88);
            pNVar5 = *(Node **)((long)&(((pNVar5->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                                       super_LockfreeIntrusiveTree<cali::Node>).m_me +
                               (pNVar5->super_LockfreeIntrusiveTree<cali::Node>).m_node);
          } while (pNVar5 != (Node *)0x0);
        }
      }
      os = local_38;
      pEVar3 = local_68.entries.
               super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pEVar9 = pEVar9 + 1;
    } while (pEVar9 != pEVar1);
    max_width = 0x18;
    if (local_68.max_key_len < 0x18) {
      max_width = local_68.max_key_len;
    }
    if (local_68.entries.
        super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_68.entries.
        super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar8 = 0;
      pEVar10 = local_68.entries.
                super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar11 = iVar8 != 0;
        iVar8 = iVar8 + -1;
        if (bVar11) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        }
        util::clamp_string(&local_88,&pEVar10->key,max_width);
        poVar4 = util::pad_right(os,&local_88,max_width);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if (pEVar10->align_right == true) {
          util::pad_left(os,&pEVar10->val,local_68.max_right_len);
        }
        else {
          util::clamp_string(&local_88,&pEVar10->val,0x34);
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,local_88._M_dataplus._M_p,local_88._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
        pEVar10 = pEVar10 + 1;
      } while (pEVar10 != pEVar3);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  pEVar10 = local_68.entries.
            super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pEVar3 = local_68.entries.
           super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_68.entries.
      super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.entries.
      super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar6 = &((local_68.entries.
                super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
                ._M_impl.super__Vector_impl_data._M_start)->val).field_2;
    do {
      plVar2 = (long *)(((string *)(paVar6 + -1))->_M_dataplus)._M_p;
      if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
        operator_delete(plVar2,paVar6->_M_allocated_capacity + 1);
      }
      if (paVar6 + -2 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)paVar6[-3]._M_allocated_capacity) {
        operator_delete((long *)paVar6[-3]._M_allocated_capacity,
                        paVar6[-2]._M_allocated_capacity + 1);
      }
      pEVar7 = (pointer)((long)paVar6 + 0x18);
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)paVar6 + 0x48);
    } while (pEVar7 != pEVar10);
  }
  if (pEVar3 != (pointer)0x0) {
    operator_delete(pEVar3,(long)local_68.entries.
                                 super__Vector_base<(anonymous_namespace)::EntryInfo,_std::allocator<(anonymous_namespace)::EntryInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pEVar3);
  }
  return os;
}

Assistant:

std::ostream& format_record_as_table(
    CaliperMetadataAccessInterface& db,
    const std::vector<Entry>&       rec,
    std::ostream&                   os
)
{
    return ::write_record_data(::unpack_record(db, rec), os);
}